

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_libc.cc
# Opt level: O0

time_t absl::time_internal::cctz::anon_unknown_10::find_trans(time_t lo,time_t hi,int offset)

{
  tm *ptVar1;
  long lVar2;
  tm *tmp;
  time_t mid;
  tm tm;
  tm *ptStack_20;
  int offset_local;
  time_t hi_local;
  time_t lo_local;
  
  tm.tm_zone._4_4_ = offset;
  ptStack_20 = (tm *)hi;
  hi_local = lo;
  while( true ) {
    if ((tm *)(hi_local + 1) == ptStack_20) {
      return (time_t)ptStack_20;
    }
    tmp = (tm *)(hi_local + ((long)ptStack_20 - hi_local) / 2);
    ptVar1 = local_time((time_t *)&tmp,(tm *)&mid);
    if (ptVar1 == (tm *)0x0) break;
    lVar2 = tm_gmtoff<tm>(ptVar1);
    if (lVar2 == tm.tm_zone._4_4_) {
      ptStack_20 = tmp;
    }
    else {
      hi_local = (time_t)tmp;
    }
  }
  do {
    hi_local = hi_local + 1;
    if ((tm *)hi_local == ptStack_20) {
      return (time_t)(tm *)hi_local;
    }
    ptVar1 = local_time(&hi_local,(tm *)&mid);
  } while ((ptVar1 == (tm *)0x0) || (lVar2 = tm_gmtoff<tm>(ptVar1), lVar2 != tm.tm_zone._4_4_));
  return hi_local;
}

Assistant:

std::time_t find_trans(std::time_t lo, std::time_t hi, int offset) {
  std::tm tm;
  while (lo + 1 != hi) {
    const std::time_t mid = lo + (hi - lo) / 2;
    std::tm* tmp = local_time(&mid, &tm);
    if (tmp != nullptr) {
      if (tm_gmtoff(*tmp) == offset) {
        hi = mid;
      } else {
        lo = mid;
      }
    } else {
      // If std::tm cannot hold some result we resort to a linear search,
      // ignoring all failed conversions.  Slow, but never really happens.
      while (++lo != hi) {
        tmp = local_time(&lo, &tm);
        if (tmp != nullptr) {
          if (tm_gmtoff(*tmp) == offset) break;
        }
      }
      return lo;
    }
  }
  return hi;
}